

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O2

int ffgtdm(fitsfile *fptr,int colnum,int maxdim,int *naxis,long *naxes,int *status)

{
  int iVar1;
  int tstatus;
  char tdimstr [71];
  char keyname [75];
  int local_dc;
  char local_d8 [80];
  char local_88 [88];
  
  local_dc = 0;
  iVar1 = *status;
  if (iVar1 < 1) {
    ffkeyn("TDIM",colnum,local_88,status);
    ffgkys(fptr,local_88,local_d8,(char *)0x0,&local_dc);
    ffdtdm(fptr,local_d8,colnum,maxdim,naxis,naxes,status);
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffgtdm(fitsfile *fptr,  /* I - FITS file pointer                        */
           int colnum,      /* I - number of the column to read             */
           int maxdim,      /* I - maximum no. of dimensions to read;       */
           int *naxis,      /* O - number of axes in the data array         */
           long naxes[],    /* O - length of each data axis                 */
           int *status)     /* IO - error status                            */
/*
  read and parse the TDIMnnn keyword to get the dimensionality of a column
*/
{
    int tstatus = 0;
    char keyname[FLEN_KEYWORD], tdimstr[FLEN_VALUE];

    if (*status > 0)
        return(*status);

    ffkeyn("TDIM", colnum, keyname, status);      /* construct keyword name */

    ffgkys(fptr, keyname, tdimstr, NULL, &tstatus); /* try reading keyword */

    ffdtdm(fptr, tdimstr, colnum, maxdim,naxis, naxes, status); /* decode it */

    return(*status);
}